

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * nonius::trim_copy_if<nonius::detail::is_spaceF>(string *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  allocator<char> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  __beg = std::
          find_if_not<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,nonius::detail::is_spaceF>
                    (uVar1,uVar2);
  uVar1 = std::__cxx11::string::end();
  __end = std::
          find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,nonius::detail::is_spaceF>
                    (__beg._M_current,uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_stack_ffffffffffffff90,__beg,__end,in_stack_ffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  return param_1;
}

Assistant:

std::string trim_copy_if(std::string const& input, PredicateT predicate) {
        const auto begin = std::find_if_not(input.begin(), input.end(), predicate);
        const auto end = std::find_if(begin, input.end(), predicate);
        return std::string(begin, end);
    }